

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O0

bool google::protobuf::compiler::java::anon_unknown_6::EqualWithSuffix
               (string_view name1,string_view suffix,string_view name2)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar1;
  string_view expected;
  size_t local_40;
  string_view name2_local;
  string_view suffix_local;
  string_view name1_local;
  
  name2_local._M_len = (size_t)name2._M_str;
  local_40 = name2._M_len;
  expected._M_str = suffix._M_str;
  name2_local._M_str = (char *)suffix._M_len;
  expected._M_len = (size_t)expected._M_str;
  bVar1 = absl::lts_20250127::ConsumeSuffix
                    ((lts_20250127 *)&local_40,(Nonnull<absl::string_view_*>)name2_local._M_str,
                     expected);
  if (bVar1) {
    __y._M_str = (char *)name2_local._M_len;
    __y._M_len = local_40;
    name1_local._M_str._7_1_ = std::operator==(name1,__y);
  }
  else {
    name1_local._M_str._7_1_ = false;
  }
  return name1_local._M_str._7_1_;
}

Assistant:

bool EqualWithSuffix(absl::string_view name1, absl::string_view suffix,
                     absl::string_view name2) {
  if (!absl::ConsumeSuffix(&name2, suffix)) return false;
  return name1 == name2;
}